

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O3

void duckdb_hll::hllRawRegHisto(uint8_t *registers,int *reghisto)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  uint64_t *word;
  
  lVar1 = 0;
  do {
    if (*(ulong *)(registers + lVar1 * 8) == 0) {
      iVar3 = 8;
      piVar2 = reghisto;
    }
    else {
      reghisto[*(ulong *)(registers + lVar1 * 8) & 0xff] =
           reghisto[*(ulong *)(registers + lVar1 * 8) & 0xff] + 1;
      reghisto[registers[lVar1 * 8 + 1]] = reghisto[registers[lVar1 * 8 + 1]] + 1;
      reghisto[registers[lVar1 * 8 + 2]] = reghisto[registers[lVar1 * 8 + 2]] + 1;
      reghisto[registers[lVar1 * 8 + 3]] = reghisto[registers[lVar1 * 8 + 3]] + 1;
      reghisto[registers[lVar1 * 8 + 4]] = reghisto[registers[lVar1 * 8 + 4]] + 1;
      reghisto[registers[lVar1 * 8 + 5]] = reghisto[registers[lVar1 * 8 + 5]] + 1;
      reghisto[registers[lVar1 * 8 + 6]] = reghisto[registers[lVar1 * 8 + 6]] + 1;
      iVar3 = 1;
      piVar2 = reghisto + registers[lVar1 * 8 + 7];
    }
    *piVar2 = *piVar2 + iVar3;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 0x200);
  return;
}

Assistant:

void hllRawRegHisto(uint8_t *registers, int* reghisto) {
    uint64_t *word = (uint64_t*) registers;
    uint8_t *bytes;
    int j;

    for (j = 0; j < HLL_REGISTERS/8; j++) {
        if (*word == 0) {
            reghisto[0] += 8;
        } else {
            bytes = (uint8_t*) word;
            reghisto[bytes[0]]++;
            reghisto[bytes[1]]++;
            reghisto[bytes[2]]++;
            reghisto[bytes[3]]++;
            reghisto[bytes[4]]++;
            reghisto[bytes[5]]++;
            reghisto[bytes[6]]++;
            reghisto[bytes[7]]++;
        }
        word++;
    }
}